

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert_to_sampled_image_pass.cpp
# Opt level: O0

Instruction *
spvtools::opt::anon_unknown_19::GetNonCopyObjectDef(DefUseManager *def_use_mgr,uint32_t inst_id)

{
  Op OVar1;
  uint32_t id;
  undefined8 local_20;
  Instruction *inst;
  uint32_t inst_id_local;
  DefUseManager *def_use_mgr_local;
  
  local_20 = analysis::DefUseManager::GetDef(def_use_mgr,inst_id);
  while( true ) {
    OVar1 = Instruction::opcode(local_20);
    if (OVar1 != OpCopyObject) break;
    id = Instruction::GetSingleWordInOperand(local_20,0);
    local_20 = analysis::DefUseManager::GetDef(def_use_mgr,id);
  }
  return local_20;
}

Assistant:

Instruction* GetNonCopyObjectDef(analysis::DefUseManager* def_use_mgr,
                                 uint32_t inst_id) {
  Instruction* inst = def_use_mgr->GetDef(inst_id);
  while (inst->opcode() == spv::Op::OpCopyObject) {
    inst_id = inst->GetSingleWordInOperand(0u);
    inst = def_use_mgr->GetDef(inst_id);
  }
  return inst;
}